

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slacking.hpp
# Opt level: O3

Json __thiscall slack::_detail::CategoryApi::test_abi_cxx11_(CategoryApi *this)

{
  string *method;
  json_value extraout_RDX;
  json_value extraout_RDX_00;
  undefined8 *in_RSI;
  Json JVar2;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  string local_40;
  json_value jVar1;
  
  method = (string *)*in_RSI;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"api.test","");
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"");
  JVar2 = Slacking::get((Slacking *)this,method,&local_40);
  jVar1 = JVar2.m_value;
  if (local_60[0] != local_50) {
    operator_delete(local_60[0]);
    jVar1 = extraout_RDX;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
    jVar1 = extraout_RDX_00;
  }
  JVar2.m_value.string = jVar1.string;
  JVar2._0_8_ = this;
  return JVar2;
}

Assistant:

inline
Json CategoryApi::test() {
    auto json = slack_.get("api.test");
    return json;
}